

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

int output_intelhex(char *fname,int length)

{
  FILE *__stream;
  int local_38;
  int local_34;
  int i;
  int sum;
  int ll;
  int cc;
  FILE *fp;
  int length_local;
  char *fname_local;
  
  sum = 0;
  __stream = fopen(fname,"w");
  if (__stream == (FILE *)0x0) {
    fname_local._4_4_ = 0;
  }
  else {
    for (; sum < length; sum = i + sum) {
      i = length - sum;
      if (0x20 < i) {
        i = 0x20;
      }
      local_34 = i + (sum >> 8) + (sum & 0xffU);
      fprintf(__stream,":%2.2X%4.4X00",(ulong)(uint)i,(ulong)(uint)sum);
      for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
        fprintf(__stream,"%2.2X",(ulong)ebuf[sum + local_38]);
        local_34 = (uint)ebuf[sum + local_38] + local_34;
      }
      fprintf(__stream,"%2.2X\n",(ulong)(0x100U - local_34 & 0xff));
    }
    fprintf(__stream,":00000001FF\n");
    fclose(__stream);
    fname_local._4_4_ = 1;
  }
  return fname_local._4_4_;
}

Assistant:

int output_intelhex(char *fname, int length)
{
   FILE *fp;
 
   int cc = 0, ll, sum, i;

   fp = fopen(fname, "w");
   if(fp == NULL) 
      return 0;
   while (cc < length)
   {
      ll = length - cc;
      if (ll > IHEXLENGTH) ll = IHEXLENGTH;
      sum = ll + (cc >> 8) + (cc & 0xff);
      fprintf(fp, ":%2.2X%4.4X00", ll, cc);
      for (i = 0; i < ll; i++)
      {
         fprintf(fp, "%2.2X", ebuf[cc + i]);
         sum += ebuf[cc + i];
      }
      fprintf(fp, "%2.2X\n", (0x100 - sum) & 0xff);
      cc += ll;
   }
   fprintf(fp, ":00000001FF\n");   
   fclose(fp);
   
   return 1;
}